

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
JsonParser_serialize_array_Test::~JsonParser_serialize_array_Test
          (JsonParser_serialize_array_Test *this)

{
  JsonParser_serialize_array_Test *this_local;
  
  ~JsonParser_serialize_array_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonParser, serialize_array) {
	json_parser parser;
	std::vector<object> array {
		true,
		1234,
		u8"text",
		object{}
	};

	EXPECT_EQ(parser.serialize<char8_t>(array),
		u8R"json([true,1234,"text",null])json");
}